

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_toc.c
# Opt level: O2

cueify_msf_t cueify_full_toc_get_point_address(cueify_full_toc *t,uint8_t session,uint8_t point)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  
  if (t == (cueify_full_toc *)0x0) {
LAB_0014e017:
    bVar1 = 0;
    bVar2 = 0;
    bVar3 = 0;
  }
  else {
    if ((point < *(byte *)((long)t + 2)) || (*(byte *)((long)t + 3) < point)) {
      if ((session < *(byte *)t) || (*(byte *)((long)t + 1) < session)) goto LAB_0014e017;
      if (point == 0xaa) {
        pbVar4 = (byte *)((long)t + (ulong)session * 0x21 + 0x391);
      }
      else if (point == 0xa1) {
        pbVar4 = (byte *)((long)t + (ulong)session * 0x21 + 0x3a3);
      }
      else {
        if (point != 0xa0) goto LAB_0014e017;
        pbVar4 = (byte *)((long)t + (ulong)session * 0x21 + 0x39a);
      }
    }
    else {
      pbVar4 = (byte *)((long)t + (ulong)point * 9 + 7);
    }
    bVar1 = *pbVar4;
    bVar2 = pbVar4[1];
    bVar3 = pbVar4[2];
  }
  return (cueify_msf_t)((uint3)bVar1 | (uint3)bVar2 << 8 | (uint3)bVar3 << 0x10);
}

Assistant:

cueify_msf_t cueify_full_toc_get_point_address(cueify_full_toc *t,
					       uint8_t session,
					       uint8_t point) {
    cueify_full_toc_private *toc = (cueify_full_toc_private *)t;
    cueify_msf_t zero;

    zero.min = 0;
    zero.sec = 0;
    zero.frm = 0;

    if (toc == NULL) {
	return zero;
    } else if (point >= toc->first_track_number &&
	       point <= toc->last_track_number) {
	return toc->tracks[point].atime;  /* session doesn't actually matter */
    } else if (session >= toc->first_session_number &&
	       session <= toc->last_session_number) {
	switch (point) {
	case CUEIFY_FULL_TOC_FIRST_TRACK_PSEUDOTRACK:
	    return toc->sessions[session].pseudotracks[1].atime;
	case CUEIFY_FULL_TOC_LAST_TRACK_PSEUDOTRACK:
	    return toc->sessions[session].pseudotracks[2].atime;
	case CUEIFY_LEAD_OUT_TRACK:
	    return toc->sessions[session].pseudotracks[0].atime;
	default:
	    return zero;
	}
    } else {
	return zero;
    }
}